

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

tjhandle tjInitTransform(void)

{
  void *__s;
  tjhandle pvVar1;
  char *pcVar2;
  
  __s = malloc(0x6d8);
  if (__s == (void *)0x0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar2,"tjInitTransform(): Memory allocation failure",0x2d);
  }
  else {
    memset(__s,0,0x6d8);
    *(undefined8 *)((long)__s + 0x608) = 0x726f727265206f4e;
    *(undefined1 *)((long)__s + 0x610) = 0;
    pvVar1 = _tjInitCompress(__s);
    if (pvVar1 != (tjhandle)0x0) {
      pvVar1 = _tjInitDecompress(__s);
      return pvVar1;
    }
  }
  return (tjhandle)0x0;
}

Assistant:

DLLEXPORT tjhandle tjInitTransform(void)
{
  tjinstance *this = NULL;
  tjhandle handle = NULL;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitTransform(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  handle = _tjInitCompress(this);
  if (!handle) return NULL;
  handle = _tjInitDecompress(this);
  return handle;
}